

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_3dmidtex.cpp
# Opt level: O0

void P_Attach3dMidtexLinesToSector(sector_t *sector,int lineid,int tag,bool ceiling)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  void *__s;
  void *__s_00;
  line_t **pplVar4;
  long lVar5;
  sector_t **ppsVar6;
  long lVar7;
  TArray<sector_t_*,_sector_t_*> *local_a0;
  sector_t *local_98;
  int local_8c;
  line_t *plStack_88;
  int i_3;
  int local_80;
  int local_7c;
  int i_2;
  int lineno;
  line_t *ln_1;
  int line_2;
  int sec_1;
  FSectorTagIterator it;
  line_t *ln;
  int line_1;
  FLineIdIterator itr;
  int sec;
  uint i_1;
  int line;
  uint i;
  BYTE *found_sectors;
  BYTE *found_lines;
  plane *scrollplane;
  int v;
  bool ceiling_local;
  int tag_local;
  int lineid_local;
  sector_t *sector_local;
  
  if ((lineid != 0) || (tag != 0)) {
    if (ceiling) {
      local_a0 = &(sector->e->Midtex).Ceiling.AttachedSectors;
    }
    else {
      local_a0 = (TArray<sector_t_*,_sector_t_*> *)&sector->e->Midtex;
    }
    __s = operator_new__((long)((numlines + 7) / 8));
    __s_00 = operator_new__((long)((numsectors + 7) / 8));
    memset(__s,0,(long)((numlines + 7) / 8));
    memset(__s_00,0,(long)((numsectors + 7) / 8));
    for (i_1 = 0; uVar2 = TArray<line_t_*,_line_t_*>::Size
                                    ((TArray<line_t_*,_line_t_*> *)(local_a0 + 1)), i_1 < uVar2;
        i_1 = i_1 + 1) {
      pplVar4 = TArray<line_t_*,_line_t_*>::operator[]
                          ((TArray<line_t_*,_line_t_*> *)(local_a0 + 1),(ulong)i_1);
      lVar5 = ((long)*pplVar4 - (long)lines) / 0x98;
      lVar7 = (long)((int)lVar5 >> 3);
      *(byte *)((long)__s + lVar7) = *(byte *)((long)__s + lVar7) | (byte)(1 << ((byte)lVar5 & 7));
    }
    for (itr.start = 0; iVar3 = itr.start, uVar2 = TArray<sector_t_*,_sector_t_*>::Size(local_a0),
        (uint)iVar3 < uVar2; itr.start = itr.start + 1) {
      ppsVar6 = TArray<sector_t_*,_sector_t_*>::operator[](local_a0,(ulong)(uint)itr.start);
      lVar5 = ((long)*ppsVar6 - (long)sectors) / 0x268;
      itr.searchtag = (int)lVar5;
      *(byte *)((long)__s_00 + (long)(itr.searchtag >> 3)) =
           *(byte *)((long)__s_00 + (long)(itr.searchtag >> 3)) | (byte)(1 << ((byte)lVar5 & 7));
    }
    TArray<line_t_*,_line_t_*>::Clear((TArray<line_t_*,_line_t_*> *)(local_a0 + 1));
    TArray<sector_t_*,_sector_t_*>::Clear(local_a0);
    if (tag == 0) {
      FLineIdIterator::FLineIdIterator((FLineIdIterator *)&stack0xffffffffffffffb0,lineid);
      while (iVar3 = FLineIdIterator::Next((FLineIdIterator *)&stack0xffffffffffffffb0), -1 < iVar3)
      {
        it = (FSectorTagIterator)(lines + iVar3);
        if (((*(sector_t **)((long)it + 0x78) != (sector_t *)0x0) &&
            (*(sector_t **)((long)it + 0x80) != (sector_t *)0x0)) &&
           ((*(DWORD *)((long)it + 0x20) & 0x200000) != 0)) {
          *(byte *)((long)__s + (long)(iVar3 >> 3)) =
               *(byte *)((long)__s + (long)(iVar3 >> 3)) | (byte)(1 << ((byte)iVar3 & 7));
        }
      }
    }
    else {
      FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&line_2,tag);
      while (ln_1._4_4_ = FSectorTagIterator::Next((FSectorTagIterator *)&line_2), -1 < ln_1._4_4_)
      {
        for (ln_1._0_4_ = 0; (int)ln_1 < sectors[ln_1._4_4_].linecount; ln_1._0_4_ = (int)ln_1 + 1)
        {
          _i_2 = sectors[ln_1._4_4_].lines[(int)ln_1];
          if ((((lineid == 0) || (bVar1 = FTagManager::LineHasID(&tagManager,_i_2,lineid), bVar1))
              && (_i_2->frontsector != (sector_t *)0x0)) &&
             ((_i_2->backsector != (sector_t *)0x0 && ((_i_2->flags & 0x200000) != 0)))) {
            lVar5 = ((long)_i_2 - (long)lines) / 0x98;
            local_7c = (int)lVar5;
            *(byte *)((long)__s + (long)(local_7c >> 3)) =
                 *(byte *)((long)__s + (long)(local_7c >> 3)) | (byte)(1 << ((byte)lVar5 & 7));
          }
        }
      }
    }
    for (local_80 = 0; local_80 < numlines; local_80 = local_80 + 1) {
      if (((uint)*(byte *)((long)__s + (long)(local_80 >> 3)) & 1 << ((byte)local_80 & 7)) != 0) {
        plStack_88 = lines + local_80;
        TArray<line_t_*,_line_t_*>::Push
                  ((TArray<line_t_*,_line_t_*> *)(local_a0 + 1),&stack0xffffffffffffff78);
        lVar5 = ((long)lines[local_80].frontsector - (long)sectors) / 0x268;
        iVar3 = (int)lVar5;
        if (numsectors <= iVar3) {
          __assert_fail("v < numsectors",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_3dmidtex.cpp"
                        ,0xc3,"void P_Attach3dMidtexLinesToSector(sector_t *, int, int, bool)");
        }
        lVar7 = (long)(iVar3 >> 3);
        *(byte *)((long)__s_00 + lVar7) =
             *(byte *)((long)__s_00 + lVar7) | (byte)(1 << ((byte)lVar5 & 7));
        lVar5 = ((long)lines[local_80].backsector - (long)sectors) / 0x268;
        iVar3 = (int)lVar5;
        if (numsectors <= iVar3) {
          __assert_fail("v < numsectors",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_3dmidtex.cpp"
                        ,199,"void P_Attach3dMidtexLinesToSector(sector_t *, int, int, bool)");
        }
        lVar7 = (long)(iVar3 >> 3);
        *(byte *)((long)__s_00 + lVar7) =
             *(byte *)((long)__s_00 + lVar7) | (byte)(1 << ((byte)lVar5 & 7));
      }
    }
    for (local_8c = 0; local_8c < numsectors; local_8c = local_8c + 1) {
      if (((uint)*(byte *)((long)__s_00 + (long)(local_8c >> 3)) & 1 << ((byte)local_8c & 7)) != 0)
      {
        local_98 = sectors + local_8c;
        TArray<sector_t_*,_sector_t_*>::Push(local_a0,&local_98);
      }
    }
    if (__s != (void *)0x0) {
      operator_delete__(__s);
    }
    if (__s_00 != (void *)0x0) {
      operator_delete__(__s_00);
    }
  }
  return;
}

Assistant:

void P_Attach3dMidtexLinesToSector(sector_t *sector, int lineid, int tag, bool ceiling)
{
	int v;

	if (lineid == 0 && tag == 0)
	{
		// invalid set of parameters
		return;
	}

	extsector_t::midtex::plane &scrollplane = ceiling? sector->e->Midtex.Ceiling : sector->e->Midtex.Floor;

	// Bit arrays that mark whether a line or sector is to be attached.
	BYTE *found_lines = new BYTE[(numlines+7)/8];
	BYTE *found_sectors = new BYTE[(numsectors+7)/8];

	memset(found_lines, 0, sizeof (BYTE) * ((numlines+7)/8));
	memset(found_sectors, 0, sizeof (BYTE) * ((numsectors+7)/8));

	// mark all lines and sectors that are already attached to this one
	// and clear the arrays. The old data will be re-added automatically
	// from the marker arrays.
	for (unsigned i=0; i < scrollplane.AttachedLines.Size(); i++)
	{
		int line = int(scrollplane.AttachedLines[i] - lines);
		found_lines[line>>3] |= 1 << (line&7);
	}

	for (unsigned i=0; i < scrollplane.AttachedSectors.Size(); i++)
	{
		int sec = int(scrollplane.AttachedSectors[i] - sectors);
		found_sectors[sec>>3] |= 1 << (sec&7);
	}

	scrollplane.AttachedLines.Clear();
	scrollplane.AttachedSectors.Clear();

	if (tag == 0)
	{
		FLineIdIterator itr(lineid);
		int line;
		while ((line = itr.Next()) >= 0)
		{
			line_t *ln = &lines[line];

			if (ln->frontsector == NULL || ln->backsector == NULL || !(ln->flags & ML_3DMIDTEX))
			{
				// Only consider two-sided lines with the 3DMIDTEX flag
				continue;
			}
			found_lines[line>>3] |= 1 << (line&7);
		}
	}
	else
	{
		FSectorTagIterator it(tag);
		int sec;
		while ((sec = it.Next()) >= 0)
		{
			for (int line = 0; line < sectors[sec].linecount; line ++)
			{
				line_t *ln = sectors[sec].lines[line];

				if (lineid != 0 && !tagManager.LineHasID(ln, lineid)) continue;

				if (ln->frontsector == NULL || ln->backsector == NULL || !(ln->flags & ML_3DMIDTEX))
				{
					// Only consider two-sided lines with the 3DMIDTEX flag
					continue;
				}
				int lineno = int(ln-lines);
				found_lines[lineno>>3] |= 1 << (lineno&7);
			}
		}
	}


	for(int i=0; i < numlines; i++)
	{
		if (found_lines[i>>3] & (1 << (i&7)))
		{
			scrollplane.AttachedLines.Push(&lines[i]);

			v = int(lines[i].frontsector - sectors);
			assert(v < numsectors);
			found_sectors[v>>3] |= 1 << (v&7);

			v = int(lines[i].backsector - sectors);
			assert(v < numsectors);
			found_sectors[v>>3] |= 1 << (v&7);
		}
	}

	for (int i=0; i < numsectors; i++)
	{
		if (found_sectors[i>>3] & (1 << (i&7)))
		{
			scrollplane.AttachedSectors.Push(&sectors[i]);
		}
	}

	delete[] found_lines;
	delete[] found_sectors;
}